

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

Float __thiscall
pbrt::DielectricInterfaceBxDF::PDF
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode,
          BxDFReflTransFlags sampleFlags)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Float FVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 in_XMM0_Qb;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined8 in_XMM2_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM4 [64];
  Vector3f wm;
  Vector3f wm_00;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_48;
  undefined1 auVar14 [16];
  
  auVar35 = in_ZMM4._0_16_;
  fVar20 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  uVar21 = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar34._4_60_ = wi._12_60_;
  auVar34._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_78 = wo.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_74 = wo.super_Tuple3<pbrt::Vector3,_float>.y;
  fStack_70 = (float)in_XMM0_Qb;
  fStack_6c = (float)((ulong)in_XMM0_Qb >> 0x20);
  uStack_80 = in_XMM2_Qb;
  local_88 = (undefined1  [8])wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18 = _local_88;
  auVar36 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                       ZEXT416((uint)(this->mfDistrib).alpha_x));
  if (auVar36._0_4_ < 0.001) {
    return 0.0;
  }
  auVar36._8_4_ = fStack_70;
  auVar36._0_8_ = uVar21;
  auVar36._12_4_ = fStack_6c;
  auVar36 = vmovshdup_avx(auVar36);
  local_88._4_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.y;
  uStack_80._0_4_ = (float)in_XMM2_Qb;
  uStack_80._4_4_ = (float)((ulong)in_XMM2_Qb >> 0x20);
  fVar11 = wi.super_Tuple3<pbrt::Vector3,_float>.x;
  local_48 = auVar36._0_4_;
  if (auVar34._0_4_ * fVar20 <= 0.0) {
    if ((sampleFlags & Transmission) == Unset) {
      return 0.0;
    }
    fVar29 = this->eta;
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar10 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg,CONCAT44(in_register_00000034,mode)), iVar10 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    auVar35._8_4_ = fStack_70;
    auVar35._0_8_ = uVar21;
    auVar35._12_4_ = fStack_6c;
    *(long *)(in_FS_OFFSET + -0x70) = *(long *)(in_FS_OFFSET + -0x70) + 1;
    uVar2 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar20),1);
    bVar3 = (bool)((byte)uVar2 & 1);
    fVar12 = (float)((uint)bVar3 * (int)fVar29 + (uint)!bVar3 * (int)(1.0 / fVar29));
    auVar14._0_4_ = fVar11 * fVar12 + local_78;
    auVar14._4_4_ = (float)local_88._4_4_ * fVar12 + fStack_74;
    auVar14._8_4_ = (float)uStack_80 * fVar12 + fStack_70;
    auVar14._12_4_ = uStack_80._4_4_ * fVar12 + fStack_6c;
    auVar13._0_4_ = auVar14._0_4_ * auVar14._0_4_;
    auVar13._4_4_ = auVar14._4_4_ * auVar14._4_4_;
    auVar13._8_4_ = auVar14._8_4_ * auVar14._8_4_;
    auVar13._12_4_ = auVar14._12_4_ * auVar14._12_4_;
    auVar36 = vhaddps_avx(auVar13,auVar13);
    fVar11 = fVar12 * auVar34._0_4_ + fVar20;
    fVar29 = fVar11 * fVar11 + auVar36._0_4_;
    if ((fVar29 == 0.0) && (!NAN(fVar29))) {
      *(long *)(in_FS_OFFSET + -0x78) = *(long *)(in_FS_OFFSET + -0x78) + 1;
      return 0.0;
    }
    auVar36 = vsqrtss_avx(ZEXT416((uint)fVar29),ZEXT416((uint)fVar29));
    auVar13 = vmovshdup_avx(auVar18);
    fVar29 = auVar36._0_4_;
    auVar16._4_4_ = fVar29;
    auVar16._0_4_ = fVar29;
    auVar16._8_4_ = fVar29;
    auVar16._12_4_ = fVar29;
    fVar11 = fVar11 / fVar29;
    auVar28 = ZEXT416((uint)fVar11);
    auVar36 = vdivps_avx(auVar14,auVar16);
    uVar1 = auVar36._0_8_;
    auVar14 = vmovshdup_avx(auVar36);
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * auVar14._0_4_)),auVar36,auVar18);
    auVar18 = vfmadd213ss_fma(auVar34._0_16_,auVar28,auVar18);
    auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ * local_48)),auVar35,auVar36);
    auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar20),auVar28);
    auVar13 = ZEXT816(0) << 0x20;
    if (0.0 < auVar18._0_4_ * auVar35._0_4_) {
      return 0.0;
    }
    auVar14 = vfmadd213ss_fma(auVar14,auVar13,auVar28);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar14._0_4_ + (fVar11 - fVar11))),auVar13,auVar36);
    if (auVar14._0_4_ < 0.0) {
      auVar28._0_8_ = uVar1 ^ 0x8000000080000000;
      auVar28._8_4_ = auVar36._8_4_ ^ 0x80000000;
      auVar28._12_4_ = auVar36._12_4_ ^ 0x80000000;
      auVar36 = auVar28;
    }
    uVar2 = vcmpss_avx512f(auVar14,auVar13,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar9._8_4_ = fStack_70;
    auVar9._0_8_ = uVar21;
    auVar9._12_4_ = fStack_6c;
    auVar33._0_4_ = auVar36._0_4_ * local_78;
    auVar33._4_4_ = auVar36._4_4_ * fStack_74;
    auVar33._8_4_ = auVar36._8_4_ * fStack_70;
    auVar33._12_4_ = auVar36._12_4_ * fStack_6c;
    auVar14 = vmovshdup_avx(auVar33);
    auVar36 = vfmadd231ss_fma(auVar14,auVar36,auVar9);
    auVar14 = vfmadd231ss_fma(auVar36,ZEXT416((uint)bVar3 * (int)-fVar11 +
                                              (uint)!bVar3 * (int)fVar11),ZEXT416((uint)fVar20));
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar16 = vandps_avx512vl(auVar14,auVar4);
    auVar28 = SUB6416(ZEXT464(0x3f800000),0);
    fVar20 = 1.0;
    auVar36 = vminss_avx(auVar28,auVar14);
    uVar21 = vcmpss_avx512f(auVar28,auVar14,1);
    bVar3 = (bool)((byte)uVar21 & 1);
    auVar17._4_12_ = auVar16._4_12_;
    bVar6 = auVar14._0_4_ < -1.0;
    fVar29 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar36._0_4_);
    bVar7 = 0.0 < fVar29;
    auVar17._0_4_ =
         (uint)bVar7 * (int)fVar29 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar16._0_4_));
    auVar36 = vfnmadd213ss_fma(auVar17,auVar17,auVar28);
    fVar29 = (float)((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
    auVar14 = ZEXT416((uint)fVar29);
    auVar36 = vmaxss_avx(auVar36,auVar13);
    auVar36 = vsqrtss_avx(auVar36,auVar36);
    auVar25._0_4_ = auVar36._0_4_ / fVar29;
    auVar25._4_12_ = auVar36._4_12_;
    if (auVar25._0_4_ < 1.0) {
      auVar36 = vfnmadd213ss_fma(auVar25,auVar25,ZEXT416(0x3f800000));
      auVar36 = vmaxss_avx(auVar36,ZEXT816(0) << 0x20);
      auVar36 = vsqrtss_avx(auVar36,auVar36);
      auVar16 = vfmsub213ss_fma(auVar17,auVar14,auVar36);
      auVar13 = vfmadd213ss_fma(auVar17,auVar14,auVar36);
      auVar37._0_4_ = auVar16._0_4_ / auVar13._0_4_;
      auVar37._4_12_ = auVar16._4_12_;
      auVar13 = vfnmadd213ss_fma(auVar36,auVar14,auVar17);
      auVar36 = vfmadd213ss_fma(auVar36,auVar14,auVar17);
      fVar20 = auVar13._0_4_ / auVar36._0_4_;
      auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar20)),auVar37,auVar37);
      fVar20 = auVar36._0_4_ * 0.5;
    }
    fVar29 = 1.0 - fVar20;
    if ((fVar29 == 0.0) && (!NAN(fVar29))) {
      return 0.0;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar10 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar10 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x60) = *(long *)(in_FS_OFFSET + -0x60) + 1;
    auVar36 = vfmadd231ss_fma(ZEXT416((uint)auVar35._0_4_),auVar18,ZEXT416((uint)fVar12));
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl(auVar18,auVar5);
    wm_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
    wm_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    wm_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar1 >> 0x20);
    FVar19 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo,wm_00);
    fVar11 = fVar29 * FVar19 * (auVar18._0_4_ / (auVar36._0_4_ * auVar36._0_4_));
    fVar29 = fVar29 + (float)((uint)((byte)sampleFlags & 1) * (int)fVar20);
  }
  else {
    if ((sampleFlags & Reflection) == Unset) {
      return 0.0;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar10 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg,CONCAT44(in_register_00000034,mode)), iVar10 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0xa0) = *(long *)(in_FS_OFFSET + -0xa0) + 1;
    local_98._0_4_ = fVar11 + local_78;
    local_98._4_4_ = (float)local_88._4_4_ + fStack_74;
    fStack_90 = (float)uStack_80 + fStack_70;
    fStack_8c = uStack_80._4_4_ + fStack_6c;
    fVar29 = auVar34._0_4_ + fVar20;
    auVar22._0_4_ = (float)local_98._0_4_ * (float)local_98._0_4_;
    auVar22._4_4_ = (float)local_98._4_4_ * (float)local_98._4_4_;
    auVar22._8_4_ = fStack_90 * fStack_90;
    auVar22._12_4_ = fStack_8c * fStack_8c;
    auVar36 = vhaddps_avx(auVar22,auVar22);
    fVar12 = fVar29 * fVar29 + auVar36._0_4_;
    if ((fVar12 == 0.0) && (!NAN(fVar12))) {
      *(long *)(in_FS_OFFSET + -0xa8) = *(long *)(in_FS_OFFSET + -0xa8) + 1;
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar10 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar10 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    auVar8._8_4_ = fStack_70;
    auVar8._0_8_ = uVar21;
    auVar8._12_4_ = fStack_6c;
    *(long *)(in_FS_OFFSET + -0x90) = *(long *)(in_FS_OFFSET + -0x90) + 1;
    auVar23._0_4_ = (float)local_98._0_4_ * local_78;
    auVar23._4_4_ = (float)local_98._4_4_ * fStack_74;
    auVar23._8_4_ = fStack_90 * fStack_70;
    auVar23._12_4_ = fStack_8c * fStack_6c;
    auVar36 = vmovshdup_avx(auVar23);
    auVar36 = vfmadd231ss_fma(auVar36,auVar8,_local_98);
    auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar29),ZEXT416((uint)fVar20));
    if (auVar36._0_4_ < 0.0) {
      *(long *)(in_FS_OFFSET + -0x98) = *(long *)(in_FS_OFFSET + -0x98) + 1;
    }
    if ((fVar12 == 0.0) && (!NAN(fVar12))) {
      return 0.0;
    }
    auVar26._0_12_ = ZEXT812(0);
    auVar26._12_4_ = 0;
    if (auVar36._0_4_ <= 0.0) {
      return 0.0;
    }
    auVar36 = vsqrtss_avx(auVar35,ZEXT416((uint)fVar12));
    auVar24._0_4_ = auVar36._0_4_;
    fVar29 = fVar29 / auVar24._0_4_;
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    auVar36 = vdivps_avx(_local_98,auVar24);
    auVar35 = vmovshdup_avx(auVar36);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * 0.0)),auVar36,auVar26);
    fVar12 = fVar29 + auVar14._0_4_;
    uVar1 = auVar36._0_8_;
    auVar31 = auVar36;
    if (fVar12 < 0.0) {
      auVar31._0_8_ = uVar1 ^ 0x8000000080000000;
      auVar31._8_4_ = auVar36._8_4_ ^ 0x80000000;
      auVar31._12_4_ = auVar36._12_4_ ^ 0x80000000;
    }
    uVar21 = vcmpss_avx512f(ZEXT416((uint)fVar12),auVar26,1);
    bVar3 = (bool)((byte)uVar21 & 1);
    auVar30._0_4_ = auVar31._0_4_ * fVar11;
    auVar30._4_4_ = auVar31._4_4_ * (float)local_88._4_4_;
    auVar30._8_4_ = auVar31._8_4_ * (float)uStack_80;
    auVar30._12_4_ = auVar31._12_4_ * uStack_80._4_4_;
    auVar14 = vmovshdup_avx(auVar30);
    auVar18 = vfmadd231ss_fma(auVar14,auVar31,auVar18);
    auVar14 = vfmadd231ss_fma(auVar18,ZEXT416((uint)bVar3 * (int)-fVar29 +
                                              (uint)!bVar3 * (int)fVar29),
                              ZEXT416((uint)auVar34._0_4_));
    local_a8 = SUB6416(ZEXT464(0x3f800000),0);
    auVar18._8_4_ = 0x7fffffff;
    auVar18._0_8_ = 0x7fffffff7fffffff;
    auVar18._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(auVar14,auVar18);
    auVar18 = vminss_avx(local_a8,auVar14);
    uVar21 = vcmpss_avx512f(local_a8,auVar14,1);
    bVar3 = (bool)((byte)uVar21 & 1);
    bVar6 = auVar14._0_4_ < -1.0;
    fVar11 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar18._0_4_);
    bVar7 = 0.0 < fVar11;
    auVar15._4_12_ = auVar13._4_12_;
    fVar12 = (float)((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
    auVar14 = ZEXT416((uint)fVar12);
    auVar15._0_4_ =
         (uint)bVar7 * (int)fVar11 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar13._0_4_));
    auVar18 = vfnmadd213ss_fma(auVar15,auVar15,local_a8);
    auVar18 = vmaxss_avx(auVar18,auVar26);
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    auVar27._0_4_ = auVar18._0_4_ / fVar12;
    auVar27._4_12_ = auVar18._4_12_;
    if (auVar27._0_4_ < 1.0) {
      auVar18 = vfnmadd213ss_fma(auVar27,auVar27,ZEXT416(0x3f800000));
      auVar18 = vmaxss_avx(auVar18,ZEXT816(0) << 0x20);
      auVar18 = vsqrtss_avx(auVar18,auVar18);
      auVar16 = vfmsub213ss_fma(auVar15,auVar14,auVar18);
      auVar13 = vfmadd213ss_fma(auVar15,auVar14,auVar18);
      auVar32._0_4_ = auVar16._0_4_ / auVar13._0_4_;
      auVar32._4_12_ = auVar16._4_12_;
      auVar13 = vfnmadd213ss_fma(auVar18,auVar14,auVar15);
      auVar18 = vfmadd213ss_fma(auVar18,auVar14,auVar15);
      fVar11 = auVar13._0_4_ / auVar18._0_4_;
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * fVar11)),auVar32,auVar32);
      local_a8 = ZEXT416((uint)(auVar18._0_4_ * 0.5));
    }
    if ((PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
         ::reg == '\0') &&
       (iVar10 = __cxa_guard_acquire(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                                      ::reg), iVar10 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                  ::reg,PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                        ::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&PDF(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode,pbrt::BxDFReflTransFlags)
                           ::reg);
    }
    *(long *)(in_FS_OFFSET + -0x80) = *(long *)(in_FS_OFFSET + -0x80) + 1;
    if (((float)local_a8._0_4_ == 0.0) && (!NAN((float)local_a8._0_4_))) {
      *(long *)(in_FS_OFFSET + -0x88) = *(long *)(in_FS_OFFSET + -0x88) + 1;
    }
    wm.super_Tuple3<pbrt::Vector3,_float>.z = fVar29;
    wm.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
    wm.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar1 >> 0x20);
    FVar19 = TrowbridgeReitzDistribution::PDF(&this->mfDistrib,wo,wm);
    auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * local_48)),auVar36,
                              ZEXT416((uint)local_78));
    auVar36 = vfmadd231ss_fma(auVar36,ZEXT416((uint)fVar29),ZEXT416((uint)fVar20));
    fVar11 = (float)local_a8._0_4_ * (FVar19 / (auVar36._0_4_ * 4.0));
    fVar29 = (float)local_a8._0_4_ +
             (float)((uint)((sampleFlags & Transmission) != Unset) *
                    (int)(1.0 - (float)local_a8._0_4_));
  }
  return fVar11 / fVar29;
}

Assistant:

Float DielectricInterfaceBxDF::PDF(Vector3f wo, Vector3f wi, TransportMode mode,
                                   BxDFReflTransFlags sampleFlags) const {
    if (mfDistrib.EffectivelySmooth())
        return 0;
    // Return PDF for non-delta dielectric interface
    if (SameHemisphere(wo, wi)) {
        // Return PDF for non-delta dielectric reflection
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            return 0;
        // Compute half-angle vector _wh_ for dielectric reflection PDF
        Vector3f wh = wo + wi;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        CHECK_RARE(1e-5f, Dot(wo, wh) < 0);
        if (LengthSquared(wh) == 0 || Dot(wo, wh) <= 0)
            return 0;
        wh = Normalize(wh);

        // Compute Fresnel factor and probabilities for dielectric reflection PDF
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        CHECK_RARE(1e-5f, F == 0);
        Float pr = F, pt = 1 - F;
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            pt = 0;

        return mfDistrib.PDF(wo, wh) / (4 * Dot(wo, wh)) * pr / (pr + pt);

    } else {
        // Return PDF for non-delta dielectric transmission
        if (!(sampleFlags & BxDFReflTransFlags::Transmission))
            return 0;
        // Compute $\wh$ for dielectric transmission PDF
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return 0;
        wh = Normalize(wh);
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return 0.;

        // Compute Fresnel factor and probabilities for dielectric transmission PDF
        Float F = FrDielectric(Dot(wo, FaceForward(wh, Normal3f(0, 0, 1))), eta);
        Float pr = F, pt = 1 - F;
        if (pt == 0)
            return 0;
        CHECK_RARE(1e-5f, (1 - F) == 0);
        if (!(sampleFlags & BxDFReflTransFlags::Reflection))
            pr = 0;

        Float dwh_dwi = AbsDot(wi, wh) / Sqr(Dot(wo, wh) + etap * Dot(wi, wh));
        return mfDistrib.PDF(wo, wh) * dwh_dwi * pt / (pr + pt);
    }
}